

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  int column_n;
  int i;
  
  for (i = 0; i < table->ColumnsCount; i = i + 1) {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i);
    if ((pIVar1->IsEnabled != false) || ((pIVar1->Flags & 8) != 0)) {
      pIVar1->AutoFitQueue = '\x02';
      pIVar1->CannotSkipItemsQueue = '\x01';
    }
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable* table)
{
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_WidthStretch)) // Cannot reset weight of hidden stretch column
            continue;
        column->CannotSkipItemsQueue = (1 << 0);
        column->AutoFitQueue = (1 << 1);
    }
}